

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tneg<int>(VM *this)

{
  int_t iVar1;
  
  iVar1 = POP<int>(this);
  PUSH<int>(this,-iVar1);
  return;
}

Assistant:

void VM::Tneg() {
    static_assert(std::is_arithmetic_v<T>);
    PUSH(-POP<T>());
}